

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O3

int __thiscall GPIO::Tools::AutoFile::close(AutoFile *this,int __fd)

{
  int in_EAX;
  runtime_error *this_00;
  int *piVar1;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  size_type *local_48;
  size_type local_40;
  size_type local_38;
  undefined8 uStack_30;
  
  if (-1 < this->m_fd) {
    in_EAX = ::close(this->m_fd);
    if (in_EAX < 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"cannot close file: ","");
      piVar1 = __errno_location();
      __s = strerror(*piVar1);
      pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_68,__s);
      local_48 = (size_type *)(pbVar2->_M_dataplus)._M_p;
      paVar3 = &pbVar2->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48 == paVar3) {
        local_38 = paVar3->_M_allocated_capacity;
        uStack_30 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
        local_48 = &local_38;
      }
      else {
        local_38 = paVar3->_M_allocated_capacity;
      }
      local_40 = pbVar2->_M_string_length;
      (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
      pbVar2->_M_string_length = 0;
      (pbVar2->field_2)._M_local_buf[0] = '\0';
      std::runtime_error::runtime_error(this_00,(string *)&local_48);
      *(undefined ***)this_00 = &PTR__runtime_error_00116be0;
      __cxa_throw(this_00,&ToolsError::typeinfo,std::runtime_error::~runtime_error);
    }
    this->m_fd = -1;
  }
  return in_EAX;
}

Assistant:

void AutoFile::close()
{
    if (m_fd < 0) return;
    if (::close(m_fd) < 0) throw ToolsError(std::string("cannot close file: ") + std::strerror(errno));
    m_fd = -1;
}